

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ConvertMaterial
          (Discreet3DSImporter *this,Material *oldMat,aiMaterial *mat)

{
  ulong uVar1;
  int eShading_;
  aiString name;
  int i;
  char local_434 [1028];
  
  uVar1 = (this->mBackgroundImage)._M_string_length;
  if ((uVar1 != 0) && (this->bHasBG == true)) {
    name.length = 0;
    name.data[0] = '\0';
    memset(name.data + 1,0x1b,0x3ff);
    if (uVar1 < 0x400) {
      name.length = (ai_uint32)uVar1;
      memcpy(name.data,(this->mBackgroundImage)._M_dataplus._M_p,uVar1);
      name.data[uVar1] = '\0';
    }
    aiMaterial::AddProperty(mat,&name,"?bg.global",0,0);
    std::__cxx11::string::string((string *)&i,"",(allocator *)&eShading_);
    std::__cxx11::string::operator=((string *)&this->mBackgroundImage,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
  }
  (oldMat->mAmbient).r = (this->mClrAmbient).r + (oldMat->mAmbient).r;
  (oldMat->mAmbient).g = (this->mClrAmbient).g + (oldMat->mAmbient).g;
  (oldMat->mAmbient).b = (this->mClrAmbient).b + (oldMat->mAmbient).b;
  name.length = 0;
  name.data[0] = '\0';
  memset(name.data + 1,0x1b,0x3ff);
  uVar1 = (oldMat->mName)._M_string_length;
  if (uVar1 < 0x400) {
    name.length = (ai_uint32)uVar1;
    memcpy(name.data,(oldMat->mName)._M_dataplus._M_p,uVar1);
    name.data[uVar1] = '\0';
  }
  aiMaterial::AddProperty(mat,&name,"?mat.name",0,0);
  aiMaterial::AddProperty(mat,&oldMat->mAmbient,1,"$clr.ambient",0,0);
  aiMaterial::AddProperty(mat,&oldMat->mDiffuse,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty(mat,&oldMat->mSpecular,1,"$clr.specular",0,0);
  aiMaterial::AddProperty(mat,&oldMat->mEmissive,1,"$clr.emissive",0,0);
  if (oldMat->mShading - Phong < 2) {
    if (((oldMat->mSpecularExponent == 0.0) && (!NAN(oldMat->mSpecularExponent))) ||
       ((oldMat->mShininessStrength == 0.0 && (!NAN(oldMat->mShininessStrength))))) {
      oldMat->mShading = Gouraud;
    }
    else {
      aiMaterial::AddProperty(mat,&oldMat->mSpecularExponent,1,"$mat.shininess",0,0);
      aiMaterial::AddProperty(mat,&oldMat->mShininessStrength,1,"$mat.shinpercent",0,0);
    }
  }
  aiMaterial::AddProperty<float>(mat,&oldMat->mTransparency,1,"$mat.opacity",0,0);
  aiMaterial::AddProperty<float>(mat,&oldMat->mBumpHeight,1,"$mat.bumpscaling",0,0);
  if (oldMat->mTwoSided == true) {
    i = 1;
    aiMaterial::AddProperty<int>(mat,&i,1,"$mat.twosided",0,0);
  }
  eShading_ = oldMat->mShading;
  switch(eShading_) {
  case 0:
    i = 1;
    aiMaterial::AddProperty<int>(mat,&i,1,"$mat.wireframe",0,0);
  case 2:
    eShading_ = Gouraud;
    break;
  case 1:
  case 3:
    break;
  case 4:
    eShading_ = 8;
    break;
  case 5:
    eShading_ = Metal;
    break;
  default:
    eShading_ = 9;
  }
  aiMaterial::AddProperty<int>(mat,&eShading_,1,"$mat.shadingm",0,0);
  if ((oldMat->sTexDiffuse).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexDiffuse,aiTextureType_DIFFUSE);
  }
  if ((oldMat->sTexSpecular).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexSpecular,aiTextureType_SPECULAR);
  }
  if ((oldMat->sTexOpacity).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexOpacity,aiTextureType_OPACITY);
  }
  if ((oldMat->sTexEmissive).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexEmissive,aiTextureType_EMISSIVE);
  }
  if ((oldMat->sTexBump).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexBump,aiTextureType_HEIGHT);
  }
  if ((oldMat->sTexShininess).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexShininess,aiTextureType_SHININESS);
  }
  if ((oldMat->sTexReflective).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexReflective,aiTextureType_REFLECTION);
  }
  uVar1 = (oldMat->mName)._M_string_length;
  if (uVar1 != 0) {
    i = 0;
    local_434[0] = '\0';
    memset(local_434 + 1,0x1b,0x3ff);
    if (uVar1 < 0x400) {
      i = (int)uVar1;
      memcpy(local_434,(oldMat->mName)._M_dataplus._M_p,uVar1);
      local_434[uVar1] = '\0';
    }
    aiMaterial::AddProperty(mat,(aiString *)&i,"?mat.name",0,0);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMaterial(D3DS::Material& oldMat,
    aiMaterial& mat)
{
    // NOTE: Pass the background image to the viewer by bypassing the
    // material system. This is an evil hack, never do it again!
    if (0 != mBackgroundImage.length() && bHasBG)
    {
        aiString tex;
        tex.Set( mBackgroundImage);
        mat.AddProperty( &tex, AI_MATKEY_GLOBAL_BACKGROUND_IMAGE);

        // Be sure this is only done for the first material
        mBackgroundImage = std::string("");
    }

    // At first add the base ambient color of the scene to the material
    oldMat.mAmbient.r += mClrAmbient.r;
    oldMat.mAmbient.g += mClrAmbient.g;
    oldMat.mAmbient.b += mClrAmbient.b;

    aiString name;
    name.Set( oldMat.mName);
    mat.AddProperty( &name, AI_MATKEY_NAME);

    // Material colors
    mat.AddProperty( &oldMat.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
    mat.AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
    mat.AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
    mat.AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);

    // Phong shininess and shininess strength
    if (D3DS::Discreet3DS::Phong == oldMat.mShading ||
        D3DS::Discreet3DS::Metal == oldMat.mShading)
    {
        if (!oldMat.mSpecularExponent || !oldMat.mShininessStrength)
        {
            oldMat.mShading = D3DS::Discreet3DS::Gouraud;
        }
        else
        {
            mat.AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);
            mat.AddProperty( &oldMat.mShininessStrength, 1, AI_MATKEY_SHININESS_STRENGTH);
        }
    }

    // Opacity
    mat.AddProperty<ai_real>( &oldMat.mTransparency,1,AI_MATKEY_OPACITY);

    // Bump height scaling
    mat.AddProperty<ai_real>( &oldMat.mBumpHeight,1,AI_MATKEY_BUMPSCALING);

    // Two sided rendering?
    if (oldMat.mTwoSided)
    {
        int i = 1;
        mat.AddProperty<int>(&i,1,AI_MATKEY_TWOSIDED);
    }

    // Shading mode
    aiShadingMode eShading = aiShadingMode_NoShading;
    switch (oldMat.mShading)
    {
        case D3DS::Discreet3DS::Flat:
            eShading = aiShadingMode_Flat; break;

        // I don't know what "Wire" shading should be,
        // assume it is simple lambertian diffuse shading
        case D3DS::Discreet3DS::Wire:
            {
                // Set the wireframe flag
                unsigned int iWire = 1;
                mat.AddProperty<int>( (int*)&iWire,1,AI_MATKEY_ENABLE_WIREFRAME);
            }

        case D3DS::Discreet3DS::Gouraud:
            eShading = aiShadingMode_Gouraud; break;

        // assume cook-torrance shading for metals.
        case D3DS::Discreet3DS::Phong :
            eShading = aiShadingMode_Phong; break;

        case D3DS::Discreet3DS::Metal :
            eShading = aiShadingMode_CookTorrance; break;

            // FIX to workaround a warning with GCC 4 who complained
            // about a missing case Blinn: here - Blinn isn't a valid
            // value in the 3DS Loader, it is just needed for ASE
        case D3DS::Discreet3DS::Blinn :
            eShading = aiShadingMode_Blinn; break;
    }
    int eShading_ = static_cast<int>(eShading);
    mat.AddProperty<int>(&eShading_, 1, AI_MATKEY_SHADING_MODEL);

    // DIFFUSE texture
    if( oldMat.sTexDiffuse.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexDiffuse, aiTextureType_DIFFUSE);

    // SPECULAR texture
    if( oldMat.sTexSpecular.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexSpecular, aiTextureType_SPECULAR);

    // OPACITY texture
    if( oldMat.sTexOpacity.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexOpacity, aiTextureType_OPACITY);

    // EMISSIVE texture
    if( oldMat.sTexEmissive.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexEmissive, aiTextureType_EMISSIVE);

    // BUMP texture
    if( oldMat.sTexBump.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexBump, aiTextureType_HEIGHT);

    // SHININESS texture
    if( oldMat.sTexShininess.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexShininess, aiTextureType_SHININESS);

    // REFLECTION texture
    if( oldMat.sTexReflective.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexReflective, aiTextureType_REFLECTION);

    // Store the name of the material itself, too
    if( oldMat.mName.length())  {
        aiString tex;
        tex.Set( oldMat.mName);
        mat.AddProperty( &tex, AI_MATKEY_NAME);
    }
}